

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
          (SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
          Size;
  if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
      Capacity <= uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x18);
    uVar3 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
            super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase
           .BeginX;
  puVar1 = (undefined8 *)((long)pvVar2 + (ulong)uVar3 * 0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)pvVar2 + (ulong)uVar3 * 0x18 + 0x10) = 0;
  uVar3 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
          Size;
  if (uVar3 < (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.Size =
         uVar3 + 1;
    return (reference)
           ((ulong)uVar3 * 0x18 +
           (long)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                 super_SmallVectorBase.BeginX);
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }